

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaGrammar.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::SchemaGrammar::addAnnotation(SchemaGrammar *this,XSAnnotation *annotation)

{
  RefHashTableOf<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher> *this_00;
  RefHashTableBucketElem<xercesc_4_0::XSAnnotation> *pRVar1;
  
  this_00 = this->fAnnotations;
  pRVar1 = this_00->fBucketList[(ulong)this % this_00->fHashModulus];
  do {
    if (pRVar1 == (RefHashTableBucketElem<xercesc_4_0::XSAnnotation> *)0x0) {
LAB_0031452f:
      RefHashTableOf<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher>::put
                (this_00,this,annotation);
      return;
    }
    if ((SchemaGrammar *)pRVar1->fKey == this) {
      if (pRVar1->fData != (XSAnnotation *)0x0) {
        XSAnnotation::setNext(pRVar1->fData,annotation);
        return;
      }
      goto LAB_0031452f;
    }
    pRVar1 = pRVar1->fNext;
  } while( true );
}

Assistant:

void SchemaGrammar::addAnnotation(XSAnnotation* const annotation)
{
    XSAnnotation* lAnnot = fAnnotations->get(this);

    if (lAnnot)
        lAnnot->setNext(annotation);
    else
        fAnnotations->put(this, annotation);
}